

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::multiSubmissionCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint64 dVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::Handle<(vk::HandleType)10>_> data_00;
  VkSemaphore *pVVar2;
  VkCommandBuffer pVVar3;
  VkResult VVar4;
  int iVar5;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue pVVar6;
  Handle<(vk::HandleType)6> *pHVar7;
  Handle<(vk::HandleType)24> *pHVar8;
  VkCommandBuffer_s **ppVVar9;
  Handle<(vk::HandleType)10> *pHVar10;
  VkAllocationCallbacks **local_3b0;
  VkCommandPool *local_398;
  allocator<char> local_2c9;
  string local_2c8;
  undefined4 local_2a8;
  allocator<char> local_2a1;
  string local_2a0;
  deUint64 local_280;
  VkAllocationCallbacks *local_278;
  deUint64 local_270;
  Move<vk::Handle<(vk::HandleType)10>_> local_268;
  RefData<vk::Handle<(vk::HandleType)10>_> local_248;
  undefined1 local_228 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkSubmitInfo submitInfo [2];
  VkCommandBuffer cmdBuffers [2];
  undefined1 local_148 [8];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  RefData<vk::Handle<(vk::HandleType)24>_> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkFence fence [2];
  undefined1 local_78 [8];
  Move<vk::Handle<(vk::HandleType)6>_> ptrFence [2];
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  pVVar6 = Context::getUniversalQueue(context);
  ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_78,vk_00,device_00,0,
                    (VkAllocationCallbacks *)0x0);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)
                    &ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                     m_allocator,vk_00,device_00,0,(VkAllocationCallbacks *)0x0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_78);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar7->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                      &ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                       m_allocator);
  dVar1 = pHVar7->m_internal;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
             device_00,2,
             ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator.
             _4_4_,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_e8,
             (Move *)&ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data.object.m_internal = local_e8.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_148,vk_00,device_00,
                    (VkCommandPool)pHVar8->m_internal);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)
                    &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                    vk_00,device_00,(VkCommandPool)pHVar8->m_internal);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_148);
  submitInfo[1].pSignalSemaphores = (VkSemaphore *)*ppVVar9;
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool
                      );
  cmdBuffers[0] = *ppVVar9;
  submitInfo[1].pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo[1].signalSemaphoreCount = 0;
  submitInfo[1]._60_4_ = 0;
  submitInfo[1].waitSemaphoreCount = 0;
  submitInfo[1]._20_4_ = 0;
  submitInfo[1].pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo[1]._4_4_ = 0;
  submitInfo[1].pNext = (void *)0x0;
  submitInfo[0].signalSemaphoreCount = 0;
  submitInfo[0]._60_4_ = 0;
  submitInfo[0].pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo[0].pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo[0].pNext = (void *)0x0;
  submitInfo[0].waitSemaphoreCount = 0;
  submitInfo[0]._20_4_ = 0;
  submitInfo[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo[0]._4_4_ = 0;
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x4;
  submitInfo[0].pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo[0]._40_8_ = &submitInfo[1].pSignalSemaphores;
  submitInfo[0].pSignalSemaphores = (VkSemaphore *)0x4;
  submitInfo[1].pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo[1]._40_8_ = cmdBuffers;
  ::vk::createEvent(&local_268,vk_00,device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_248,(Move *)&local_268);
  data_00.deleter.m_deviceIface = local_248.deleter.m_deviceIface;
  data_00.object.m_internal = local_248.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_248.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_248.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_248.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_228,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_268);
  beginCommandBuffer(vk_00,(VkCommandBuffer)submitInfo[1].pSignalSemaphores);
  pVVar2 = submitInfo[1].pSignalSemaphores;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_228);
  local_270 = pHVar10->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])(vk_00,pVVar2,local_270,1);
  endCommandBuffer(vk_00,(VkCommandBuffer)submitInfo[1].pSignalSemaphores);
  beginCommandBuffer(vk_00,cmdBuffers[0]);
  pVVar3 = cmdBuffers[0];
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_228);
  (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,pVVar3,1,pHVar10,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk_00,cmdBuffers[0]);
  local_278 = cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  VVar4 = (*vk_00->_vptr_DeviceInterface[2])
                    (vk_00,pVVar6,1,
                     &event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator,
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo[SET], fence[SET])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x106);
  local_280 = dVar1;
  VVar4 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar6,1,&submitInfo[0].pSignalSemaphores,dVar1);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo[WAIT], fence[WAIT])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x107);
  iVar5 = (*vk_00->_vptr_DeviceInterface[0x16])
                    (vk_00,device_00,2,
                     &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator,1,0xffffffffffffffff);
  if (iVar5 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"Wait and set even on device multi submission tests pass",
               &local_2c9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Queue should end execution",&local_2a1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
  }
  local_2a8 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_228);
  local_398 = &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  do {
    local_398 = local_398 + -4;
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
              ((Move<vk::VkCommandBuffer_s_*> *)local_398);
  } while (local_398 != (VkCommandPool *)local_148);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  local_3b0 = &ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
  do {
    local_3b0 = local_3b0 + -4;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)6>_> *)local_3b0);
  } while (local_3b0 != (VkAllocationCallbacks **)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multiSubmissionCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Move<VkFence>				ptrFence[COUNT]		=
	{
		createFence(vk, device),
		createFence(vk, device)
	};
	VkFence							fence[COUNT]		= {*ptrFence[SET], *ptrFence[WAIT]};
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
	VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[SET], *ptrCmdBuffer[WAIT]};
	const VkSubmitInfo				submitInfo[COUNT]	=
														{
															{
																VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																DE_NULL,						// const void*					pNext;
																0u,								// deUint32						waitSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																1u,								// deUint32						commandBufferCount;
																&cmdBuffers[SET],				// const VkCommandBuffer*		pCommandBuffers;
																0u,								// deUint32						signalSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
															},
															{
																VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																DE_NULL,						// const void*					pNext;
																0u,								// deUint32						waitSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																1u,								// deUint32						commandBufferCount;
																&cmdBuffers[WAIT],				// const VkCommandBuffer*		pCommandBuffers;
																0u,								// deUint32						signalSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
															}
														};
	const Unique<VkEvent>			event				(createEvent(vk, device));

	beginCommandBuffer(vk, cmdBuffers[SET]);
	vk.cmdSetEvent(cmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, cmdBuffers[SET]);

	beginCommandBuffer(vk, cmdBuffers[WAIT]);
	vk.cmdWaitEvents(cmdBuffers[WAIT], 1u, &event.get(), VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, cmdBuffers[WAIT]);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo[SET], fence[SET]));
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo[WAIT], fence[WAIT]));

	if (VK_SUCCESS != vk.waitForFences(device, 2u, fence, DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device multi submission tests pass");
}